

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input_source_interpolation_with_magic_number.cc
# Opt level: O3

void __thiscall
sptk::InputSourceInterpolationWithMagicNumber::CalculateIncrement
          (InputSourceInterpolationWithMagicNumber *this)

{
  double dVar1;
  double dVar2;
  double dVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  pointer pdVar7;
  pointer pdVar8;
  pointer pdVar9;
  long lVar10;
  double dVar11;
  
  iVar4 = this->data_length_;
  if (0 < (long)iVar4) {
    iVar5 = this->interpolation_period_;
    iVar6 = this->frame_period_;
    pdVar7 = (this->curr_data_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar8 = (this->next_data_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar9 = (this->increment_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar10 = 0;
    do {
      dVar1 = this->magic_number_;
      dVar2 = pdVar8[lVar10];
      dVar11 = 1.79769313486232e+308;
      if ((dVar1 != dVar2) || (NAN(dVar1) || NAN(dVar2))) {
        dVar3 = pdVar7[lVar10];
        dVar11 = 1.79769313486232e+308;
        if ((dVar1 != dVar3) || (NAN(dVar1) || NAN(dVar3))) {
          dVar11 = (dVar2 - dVar3) * ((double)iVar5 / (double)iVar6);
        }
      }
      pdVar9[lVar10] = dVar11;
      lVar10 = lVar10 + 1;
    } while (iVar4 != lVar10);
  }
  return;
}

Assistant:

void InputSourceInterpolationWithMagicNumber::CalculateIncrement() {
  const double rate(static_cast<double>(interpolation_period_) / frame_period_);
  for (int i(0); i < data_length_; ++i) {
    if (magic_number_ == next_data_[i] || magic_number_ == curr_data_[i]) {
      increment_[i] = kCannotCalculateIncrements;
    } else {
      increment_[i] = rate * (next_data_[i] - curr_data_[i]);
    }
  }
}